

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpath_parser.hpp
# Opt level: O2

void __thiscall
jsoncons::jsonpath::detail::
jsonpath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
::unwind_rparen(jsonpath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                *this,error_code *ec)

{
  pointer ptVar1;
  pointer ptVar2;
  const_iterator cVar3;
  const_iterator __first;
  
  cVar3._M_current =
       (this->operator_stack_).
       super__Vector_base<jsoncons::jsonpath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>,_std::allocator<jsoncons::jsonpath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    __first._M_current = cVar3._M_current + -1;
    ptVar1 = (this->operator_stack_).
             super__Vector_base<jsoncons::jsonpath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>,_std::allocator<jsoncons::jsonpath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ptVar2 = cVar3._M_current;
    if ((cVar3._M_current == ptVar1) ||
       (ptVar2 = ptVar1, (__first._M_current)->token_kind_ == lparen)) break;
    std::
    vector<jsoncons::jsonpath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>&>,std::allocator<jsoncons::jsonpath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>&>>>
    ::
    emplace_back<jsoncons::jsonpath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>&>>
              ((vector<jsoncons::jsonpath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>&>,std::allocator<jsoncons::jsonpath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>&>>>
                *)&this->output_stack_,__first._M_current);
    cVar3._M_current = __first._M_current;
  }
  if (cVar3._M_current == ptVar2) {
    std::error_code::operator=(ec,unbalanced_parentheses);
    return;
  }
  std::
  vector<jsoncons::jsonpath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>,_std::allocator<jsoncons::jsonpath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>
  ::erase(&this->operator_stack_,__first,
          (this->operator_stack_).
          super__Vector_base<jsoncons::jsonpath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>,_std::allocator<jsoncons::jsonpath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>
          ._M_impl.super__Vector_impl_data._M_finish);
  return;
}

Assistant:

void unwind_rparen(std::error_code& ec)
        {
            auto it = operator_stack_.rbegin();
            while (it != operator_stack_.rend() && !(*it).is_lparen())
            {
                output_stack_.emplace_back(std::move(*it));
                ++it;
            }
            if (it == operator_stack_.rend())
            {
                ec = jsonpath_errc::unbalanced_parentheses;
                return;
            }
            ++it;
            operator_stack_.erase(it.base(),operator_stack_.end());
        }